

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O3

REF_STATUS ref_dict_bcast(REF_DICT ref_dict,REF_MPI ref_mpi)

{
  size_t __size;
  int n_00;
  uint uVar1;
  undefined8 in_RAX;
  void *data;
  void *data_00;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  REF_INT n;
  undefined8 uStack_38;
  
  if (ref_mpi->n < 2) {
    return 0;
  }
  uStack_38 = in_RAX;
  if (ref_mpi->id == 0) {
    uStack_38 = CONCAT44(ref_dict->n,(int)in_RAX);
  }
  uVar1 = ref_mpi_bcast(ref_mpi,(void *)((long)&uStack_38 + 4),1,1);
  if (uVar1 == 0) {
    n_00 = uStack_38._4_4_;
    if ((long)uStack_38._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd7,
             "ref_dict_bcast","malloc keys of REF_INT negative");
      return 1;
    }
    __size = (long)uStack_38._4_4_ * 4;
    data = malloc(__size);
    if (data == (void *)0x0) {
      pcVar7 = "malloc keys of REF_INT NULL";
      uVar3 = 0xd7;
    }
    else {
      data_00 = malloc(__size);
      if (data_00 != (void *)0x0) {
        if ((ref_mpi->id == 0) && (uVar2 = (ulong)ref_dict->n, 0 < (long)uVar2)) {
          RVar5 = *ref_dict->key;
          RVar6 = *ref_dict->value;
          uVar4 = 1;
          do {
            *(REF_INT *)((long)data + uVar4 * 4 + -4) = RVar5;
            *(REF_INT *)((long)data_00 + uVar4 * 4 + -4) = RVar6;
            RVar5 = -1;
            RVar6 = -1;
            if (uVar4 < uVar2) {
              RVar5 = ref_dict->key[uVar4];
              RVar6 = ref_dict->value[uVar4];
            }
            bVar9 = uVar4 != uVar2;
            uVar4 = uVar4 + 1;
          } while (bVar9);
        }
        uVar1 = ref_mpi_bcast(ref_mpi,data,n_00,1);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(ref_mpi,data_00,uStack_38._4_4_,1);
          if (uVar1 == 0) {
            if ((ref_mpi->id != 0) && (0 < uStack_38._4_4_)) {
              lVar8 = 0;
              do {
                uVar1 = ref_dict_store(ref_dict,*(REF_INT *)((long)data + lVar8 * 4),
                                       *(REF_INT *)((long)data_00 + lVar8 * 4));
                if (uVar1 != 0) {
                  pcVar7 = "store";
                  uVar3 = 0xe3;
                  goto LAB_001211b1;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < uStack_38._4_4_);
            }
            free(data_00);
            free(data);
            return 0;
          }
          pcVar7 = "bcast values";
          uVar3 = 0xe0;
        }
        else {
          pcVar7 = "bcast keys";
          uVar3 = 0xdf;
        }
        goto LAB_001211b1;
      }
      pcVar7 = "malloc values of REF_INT NULL";
      uVar3 = 0xd8;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar3,
           "ref_dict_bcast",pcVar7);
    uVar1 = 2;
  }
  else {
    pcVar7 = "bcast n";
    uVar3 = 0xd6;
LAB_001211b1:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar3,
           "ref_dict_bcast",(ulong)uVar1,pcVar7);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_dict_bcast(REF_DICT ref_dict, REF_MPI ref_mpi) {
  REF_INT n;
  REF_INT *keys, *values;
  REF_INT i, index, key, value;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (ref_mpi_once(ref_mpi)) {
    n = ref_dict_n(ref_dict);
  }
  RSS(ref_mpi_bcast(ref_mpi, &n, 1, REF_INT_TYPE), "bcast n");
  ref_malloc(keys, n, REF_INT);
  ref_malloc(values, n, REF_INT);
  if (ref_mpi_once(ref_mpi)) {
    each_ref_dict_key_value(ref_dict, index, key, value) {
      keys[index] = key;
      values[index] = value;
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, keys, n, REF_INT_TYPE), "bcast keys");
  RSS(ref_mpi_bcast(ref_mpi, values, n, REF_INT_TYPE), "bcast values");
  if (!ref_mpi_once(ref_mpi)) {
    for (i = 0; i < n; i++) {
      RSS(ref_dict_store(ref_dict, keys[i], values[i]), "store");
    }
  }
  ref_free(values);
  ref_free(keys);
  return REF_SUCCESS;
}